

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

uint32_t * __thiscall
vsencoding::VSEncodingBlocks::decodeArray
          (VSEncodingBlocks *this,uint32_t *in,size_t param_3,uint32_t *out,size_t *nvalue)

{
  ulong uVar1;
  undefined8 uVar2;
  uint32_t *puVar3;
  ulong in_RCX;
  uint *in_RSI;
  long in_RDI;
  ulong *in_R8;
  uint32_t *unaff_retaddr;
  uint32_t *in_stack_00000008;
  uint32_t *in_stack_00000010;
  uint32_t in_stack_0000001c;
  VSEncodingBlocks *in_stack_00000020;
  uint32_t *ans;
  uint32_t sum;
  uint32_t res;
  size_t orignvalue;
  uint32_t *initout;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  NotEnoughStorage *in_stack_ffffffffffffff70;
  uint local_48;
  ulong local_20;
  
  uVar1 = *in_R8;
  if (uVar1 < *in_RSI) {
    uVar2 = __cxa_allocate_exception(0x18);
    FastPForLib::NotEnoughStorage::NotEnoughStorage
              (in_stack_ffffffffffffff70,
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    __cxa_throw(uVar2,&FastPForLib::NotEnoughStorage::typeinfo,
                FastPForLib::NotEnoughStorage::~NotEnoughStorage);
  }
  *in_R8 = (ulong)*in_RSI;
  local_20 = in_RCX;
  for (local_48 = (uint)*in_R8; *(uint *)(in_RDI + 8) < local_48;
      local_48 = local_48 - *(int *)(in_RDI + 8)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),0);
    decodeVS(in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_00000008,unaff_retaddr);
    local_20 = local_20 + (ulong)*(uint *)(in_RDI + 8) * 4;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),0);
  puVar3 = decodeVS(in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_00000008,
                    unaff_retaddr);
  if (in_RCX + uVar1 * 4 < local_20) {
    fprintf(_stderr,"possible overrun\n");
  }
  return puVar3;
}

Assistant:

inline const uint32_t *VSEncodingBlocks::decodeArray(const uint32_t *in,
#ifndef NDEBUG
                                              const size_t len, uint32_t *out,
                                              size_t &nvalue) {
#else
                                              const size_t, uint32_t *out,
                                              size_t &nvalue) {
#endif
#ifndef NDEBUG
  const uint32_t *const initin(in);
#endif
  const uint32_t *const initout(out);
  const size_t orignvalue = nvalue;
  if ((*in) > orignvalue)
    throw NotEnoughStorage(*in);
  nvalue = *(in++);
  uint32_t res;
  uint32_t sum;

  // __validate(in, (len << 2));
  //__validate(out, ((nvalue + TAIL_MERGIN) << 2));

  for (res = static_cast<uint32_t>(nvalue); res > VSENCODING_BLOCKSZ;
       out += VSENCODING_BLOCKSZ, in += sum, res -= VSENCODING_BLOCKSZ) {
    sum = *in++;
    decodeVS(VSENCODING_BLOCKSZ, in, out, &__tmp[0]);
  }

  const uint32_t *ans = decodeVS(res, in, out, &__tmp[0]);
  assert(initin + len >= in);
  if (initout + orignvalue < out)
    fprintf(stderr, "possible overrun\n");
  return ans;
}